

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O0

virtual_column_map_t *
duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileGetVirtualColumns
          (ClientContext *context,optional_ptr<duckdb::FunctionData,_true> bind_data_p)

{
  MultiFileBindData *pMVar1;
  ClientContext *in_RSI;
  optional_ptr<duckdb::FunctionData,_true> *in_RDI;
  MultiFileBindData *bind_data;
  virtual_column_map_t *result;
  virtual_column_map_t *in_stack_000000b0;
  MultiFileBindData *in_stack_000000b8;
  ClientContext *in_stack_000000c0;
  optional_ptr<duckdb::FunctionData,_true> *this;
  
  this = in_RDI;
  optional_ptr<duckdb::FunctionData,_true>::operator->(in_RDI);
  pMVar1 = FunctionData::Cast<duckdb::MultiFileBindData>((FunctionData *)this);
  std::
  unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
  ::unordered_map((unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
                   *)0x653dd5);
  duckdb::MultiFileReader::GetVirtualColumns(in_RSI,&pMVar1->reader_bind,(unordered_map *)this);
  ParquetMultiFileInfo::GetVirtualColumns(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  std::
  unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
  ::operator=((unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
               *)this,(unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
                       *)in_RDI);
  return (virtual_column_map_t *)in_RDI;
}

Assistant:

static virtual_column_map_t MultiFileGetVirtualColumns(ClientContext &context,
	                                                       optional_ptr<FunctionData> bind_data_p) {
		auto &bind_data = bind_data_p->Cast<MultiFileBindData>();
		virtual_column_map_t result;
		MultiFileReader::GetVirtualColumns(context, bind_data.reader_bind, result);

		OP::GetVirtualColumns(context, bind_data, result);

		bind_data.virtual_columns = result;
		return result;
	}